

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

void __thiscall
EOPlus::Parser::ParseRuleActionBlock
          (Parser *this,deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_> *rules,
          deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *actions,
          function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *custom_handler,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *error_handler)

{
  bool bVar1;
  pointer pPVar2;
  bool local_1003;
  allocator<char> local_fb9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fb8;
  Token local_f98;
  string local_f48;
  undefined4 local_f24;
  string local_f20;
  Token local_f00;
  string local_eb0;
  undefined1 local_e90 [8];
  Action action_2;
  undefined1 local_ce8 [8];
  Action action_1;
  Rule rule_1;
  string local_910;
  string local_8f0;
  undefined1 local_8d0 [8];
  Action action;
  Rule rule;
  Action local_4e0;
  string local_358;
  Rule local_338;
  string local_f0;
  variant local_c0;
  undefined1 local_80 [8];
  Token t;
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *error_handler_local;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  *custom_handler_local;
  deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *actions_local;
  deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_> *rules_local;
  Parser *this_local;
  
  t._72_8_ = error_handler;
  util::variant::variant(&local_c0);
  Token::Token((Token *)local_80,Invalid,&local_c0);
  util::variant::~variant(&local_c0);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                bVar1 = GetToken(this,(Token *)local_80,0x41);
                if (!bVar1) goto LAB_0017b2e7;
                if (local_80._0_4_ == Identifier) break;
                if (local_80._0_4_ == Symbol) {
                  util::variant::operator_cast_to_string(&local_f20,(variant *)&t);
                  bVar1 = std::operator==(&local_f20,"}");
                  std::__cxx11::string::~string((string *)&local_f20);
                  if (bVar1) {
                    local_f24 = 1;
                    goto LAB_0017b34d;
                  }
                  util::variant::operator_cast_to_string(&local_f48,(variant *)&t);
                  bVar1 = std::operator==(&local_f48,";");
                  std::__cxx11::string::~string((string *)&local_f48);
                  if (!bVar1) {
                    pPVar2 = std::
                             unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                             ::operator->(&this->tok);
                    Token::Token(&local_f98,(Token *)local_80);
                    Parser_Token_Server_Base::PutBack(pPVar2,&local_f98);
                    Token::~Token(&local_f98);
                    goto LAB_0017b2e7;
                  }
                }
              }
              util::variant::operator_cast_to_string(&local_f0,(variant *)&t);
              bVar1 = std::operator==(&local_f0,"rule");
              std::__cxx11::string::~string((string *)&local_f0);
              if (!bVar1) break;
              ParseRule(&local_338,this);
              std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::push_back(rules,&local_338);
              Rule::~Rule(&local_338);
            }
            util::variant::operator_cast_to_string(&local_358,(variant *)&t);
            bVar1 = std::operator==(&local_358,"action");
            std::__cxx11::string::~string((string *)&local_358);
            if (!bVar1) break;
            ParseAction(&local_4e0,this);
            std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::push_back
                      (actions,&local_4e0);
            Action::~Action(&local_4e0);
          }
          util::variant::operator_cast_to_string
                    ((string *)
                     ((long)&rule.action.expr.args.
                             super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                             _M_impl.super__Deque_impl_data + 0x48),(variant *)&t);
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&rule.action.expr.args.
                                             super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                             ._M_impl.super__Deque_impl_data + 0x48),"if");
          std::__cxx11::string::~string
                    ((string *)
                     ((long)&rule.action.expr.args.
                             super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                             _M_impl.super__Deque_impl_data + 0x48));
          if (!bVar1) break;
          ParseRule((Rule *)((long)&action.expr.args.
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_finish + 0x18),this);
          Action::Action((Action *)local_8d0);
          local_8d0._0_4_ = If;
          Expression::operator=
                    ((Expression *)&action,
                     (Expression *)
                     ((long)&action.expr.args.
                             super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                             _M_impl.super__Deque_impl_data._M_finish + 0x18));
          Expression::operator=
                    ((Expression *)
                     ((long)&action.cond_expr.args.
                             super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                             _M_impl.super__Deque_impl_data._M_finish + 0x18),
                     (Expression *)
                     ((long)&rule.action.cond_expr.args.
                             super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                             _M_impl.super__Deque_impl_data + 0x48));
          std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::push_back
                    (actions,(value_type *)local_8d0);
          Action::~Action((Action *)local_8d0);
          Rule::~Rule((Rule *)((long)&action.expr.args.
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_finish + 0x18));
        }
        rule_1.action.expr.args.super__Deque_base<util::variant,_std::allocator<util::variant>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ = 0;
        util::variant::operator_cast_to_string(&local_8f0,(variant *)&t);
        bVar1 = std::operator==(&local_8f0,"elseif");
        local_1003 = true;
        if (!bVar1) {
          util::variant::operator_cast_to_string(&local_910,(variant *)&t);
          rule_1.action.expr.args.super__Deque_base<util::variant,_std::allocator<util::variant>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_node._7_1_ = 1;
          local_1003 = std::operator==(&local_910,"elif");
        }
        if ((rule_1.action.expr.args.
             super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node._7_1_ & 1) != 0) {
          std::__cxx11::string::~string((string *)&local_910);
        }
        std::__cxx11::string::~string((string *)&local_8f0);
        if (local_1003 == false) break;
        ParseRule((Rule *)((long)&action_1.expr.args.
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_finish + 0x18),this);
        Action::Action((Action *)local_ce8);
        local_ce8._0_4_ = ElseIf;
        Expression::operator=
                  ((Expression *)&action_1,
                   (Expression *)
                   ((long)&action_1.expr.args.
                           super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                           super__Deque_impl_data._M_finish + 0x18));
        Expression::operator=
                  ((Expression *)
                   ((long)&action_1.cond_expr.args.
                           super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                           super__Deque_impl_data._M_finish + 0x18),
                   (Expression *)
                   ((long)&rule_1.action.cond_expr.args.
                           super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                           super__Deque_impl_data + 0x48));
        std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::push_back
                  (actions,(value_type *)local_ce8);
        Action::~Action((Action *)local_ce8);
        Rule::~Rule((Rule *)((long)&action_1.expr.args.
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_finish + 0x18));
      }
      util::variant::operator_cast_to_string
                ((string *)
                 ((long)&action_2.expr.args.
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_finish + 0x18),(variant *)&t);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&action_2.expr.args.
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_finish + 0x18),"else");
      std::__cxx11::string::~string
                ((string *)
                 ((long)&action_2.expr.args.
                         super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                         super__Deque_impl_data._M_finish + 0x18));
      if (!bVar1) break;
      ParseAction((Action *)local_e90,this);
      local_e90._0_4_ = Else;
      std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::push_back
                (actions,(value_type *)local_e90);
      Action::~Action((Action *)local_e90);
    }
    util::variant::operator_cast_to_string(&local_eb0,(variant *)&t);
    bVar1 = std::
            function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
            ::operator()(custom_handler,&local_eb0);
    std::__cxx11::string::~string((string *)&local_eb0);
  } while (((bVar1 ^ 0xffU) & 1) == 0);
  pPVar2 = std::
           unique_ptr<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
           ::operator->(&this->tok);
  Token::Token(&local_f00,(Token *)local_80);
  Parser_Token_Server_Base::PutBack(pPVar2,&local_f00);
  Token::~Token(&local_f00);
LAB_0017b2e7:
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fb8,"rule/action/if/elseif/else",&local_fb9);
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>::
  operator()(error_handler,&local_fb8);
  std::__cxx11::string::~string((string *)&local_fb8);
  std::allocator<char>::~allocator(&local_fb9);
  local_f24 = 0;
LAB_0017b34d:
  Token::~Token((Token *)local_80);
  return;
}

Assistant:

void Parser::ParseRuleActionBlock(std::deque<Rule>& rules, std::deque<Action>& actions, std::function<bool(std::string)> custom_handler, std::function<void(std::string)> error_handler)
	{
		Token t;

		while (this->GetToken(t, Token::Identifier | Token::Symbol))
		{
			if (t.type == Token::Identifier)
			{
				if (std::string(t.data) == "rule")
				{
					rules.push_back(this->ParseRule());
				}
				else if (std::string(t.data) == "action")
				{
					actions.push_back(this->ParseAction());
				}
				else if (std::string(t.data) == "if")
				{
					Rule rule = this->ParseRule();
					Action action;
					action.cond = Action::If;
					action.cond_expr = rule.expr;
					action.expr = rule.action.expr;
					actions.push_back(action);
				}
				else if (std::string(t.data) == "elseif" || std::string(t.data) == "elif")
				{
					Rule rule = this->ParseRule();
					Action action;
					action.cond = Action::ElseIf;
					action.cond_expr = rule.expr;
					action.expr = rule.action.expr;
					actions.push_back(action);
				}
				else if (std::string(t.data) == "else")
				{
					Action action = this->ParseAction();
					action.cond = Action::Else;
					actions.push_back(action);
				}
				else
				{
					if (!custom_handler(std::string(t.data)))
					{
						this->tok->PutBack(t);
						break;
					}
				}
			}
			else if (t.type == Token::Symbol)
			{
				if (std::string(t.data) == "}")
				{
					return;
				}
				else if (std::string(t.data) == ";")
				{
					continue;
				}
				else
				{
					this->tok->PutBack(t);
					break;
				}
			}
		}

		// PARSER_ERROR_GOT("Expected rule-action-block entry (rule/action) or closing brace '}'.")
		error_handler("rule/action/if/elseif/else");
	}